

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_generic_simpleArgs
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,size_t *dstPos,void *src,
                 size_t srcSize,size_t *srcPos,ZSTD_EndDirective endOp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined8 *in_RCX;
  size_t cErr;
  ZSTD_inBuffer input;
  ZSTD_outBuffer output;
  ZSTD_EndDirective in_stack_000000d4;
  ZSTD_inBuffer *in_stack_000000d8;
  ZSTD_outBuffer *in_stack_000000e0;
  ZSTD_CCtx *in_stack_000000e8;
  
  uVar1 = *in_RCX;
  uVar2 = *input.src;
  sVar3 = ZSTD_compress_generic
                    (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
  *in_RCX = uVar1;
  *(undefined8 *)input.src = uVar2;
  return sVar3;
}

Assistant:

size_t ZSTD_compress_generic_simpleArgs (
                            ZSTD_CCtx* cctx,
                            void* dst, size_t dstCapacity, size_t* dstPos,
                      const void* src, size_t srcSize, size_t* srcPos,
                            ZSTD_EndDirective endOp)
{
    ZSTD_outBuffer output = { dst, dstCapacity, *dstPos };
    ZSTD_inBuffer  input  = { src, srcSize, *srcPos };
    /* ZSTD_compress_generic() will check validity of dstPos and srcPos */
    size_t const cErr = ZSTD_compress_generic(cctx, &output, &input, endOp);
    *dstPos = output.pos;
    *srcPos = input.pos;
    return cErr;
}